

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

int emit_reg_accessor(Function *fn,Pseudo *pseudo,uint discriminator)

{
  uint uVar1;
  uint k;
  uint discriminator_local;
  Pseudo *pseudo_local;
  Function *fn_local;
  
  if (((discriminator != 0) && (discriminator != 1)) && (discriminator != 2)) {
    __assert_fail("discriminator == 0 || discriminator == 1 || discriminator == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/codegen.c"
                  ,0x3ee,"int emit_reg_accessor(Function *, const Pseudo *, unsigned int)");
  }
  if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xd) {
    raviX_buffer_add_fstring(&fn->body,"S(%d)",(ulong)(pseudo->field_3).range_in_use);
  }
  else if (((((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x4) ||
           (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xb)) ||
          (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xc)) {
    uVar1 = compute_register_from_base(fn,pseudo);
    raviX_buffer_add_fstring(&fn->body,"R(%d)",(ulong)uVar1);
  }
  else if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x0) {
    if (((pseudo->field_3).symbol)->symbol_type == SYM_LOCAL) {
      uVar1 = compute_register_from_base(fn,pseudo);
      raviX_buffer_add_fstring(&fn->body,"R(%d)",(ulong)uVar1);
    }
    else {
      if (((pseudo->field_3).symbol)->symbol_type != SYM_UPVALUE) {
        handle_error_bad_pseudo(fn,pseudo,"emit_reg_accessor: Unexpected pseudo symbol type");
        return -1;
      }
      raviX_buffer_add_fstring
                (&fn->body,"cl->upvals[%d]->v",
                 (ulong)(*(uint *)((long)&((pseudo->field_3).symbol)->field_1 + 0x20) & 0xffff));
    }
  }
  else if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x5) {
    if (((pseudo->field_3).constant)->type == 0x101) {
      raviX_buffer_add_fstring(&fn->body,"K(%d)",(ulong)((pseudo->field_3).constant)->index);
    }
    else if (((pseudo->field_3).constant)->type == 8) {
      raviX_buffer_add_fstring
                (&fn->body,"&ival%u; ival%u.value_.i = %lld",(ulong)discriminator,
                 (ulong)discriminator,((pseudo->field_3).proc)->nodes);
    }
    else if (((pseudo->field_3).constant)->type == 0x10) {
      raviX_buffer_add_fstring
                (&fn->body,"&fval%u; fval%u.value_.n = ",(ulong)discriminator,(ulong)discriminator);
      raviX_buffer_add_double(&fn->body,(((pseudo->field_3).constant)->field_2).n);
    }
    else if (((pseudo->field_3).constant)->type == 1) {
      raviX_buffer_add_string(&fn->body,"&nilval");
    }
    else {
      if (((pseudo->field_3).constant)->type != 7) {
        handle_error_bad_pseudo(fn,pseudo,"emit_reg_accessor: Unexpected pseudo constant type");
        return -1;
      }
      raviX_buffer_add_fstring
                (&fn->body,"&bval%u; bval%u.value_.b = %d",(ulong)discriminator,(ulong)discriminator
                 ,(ulong)((pseudo->field_3).proc)->nodes & 0xffffffff);
    }
  }
  else if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x1) {
    raviX_buffer_add_fstring
              (&fn->body,"&fval%u; fval%u.value_.n = ",(ulong)discriminator,(ulong)discriminator);
    emit_varname(fn,pseudo);
  }
  else if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x2) {
    raviX_buffer_add_fstring
              (&fn->body,"&ival%u; ival%u.value_.i = ",(ulong)discriminator,(ulong)discriminator);
    emit_varname(fn,pseudo);
  }
  else if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x7) {
    raviX_buffer_add_string(&fn->body,"&nilval");
  }
  else if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x8) {
    raviX_buffer_add_fstring
              (&fn->body,"&bval%u; bval%u.value_.b = 1",(ulong)discriminator,(ulong)discriminator);
  }
  else if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x9) {
    raviX_buffer_add_fstring
              (&fn->body,"&bval%u; bval%u.value_.b = 0",(ulong)discriminator,(ulong)discriminator);
  }
  else {
    if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) != (undefined1  [48])0x3) {
      handle_error_bad_pseudo(fn,pseudo,"emit_reg_accessor: Unexpected pseudo type");
      return -1;
    }
    raviX_buffer_add_fstring
              (&fn->body,"&bval%u; bval%u.value_.b = ",(ulong)discriminator,(ulong)discriminator);
    emit_varname(fn,pseudo);
  }
  return 0;
}

Assistant:

static int emit_reg_accessor(Function *fn, const Pseudo *pseudo, unsigned discriminator)
{
	assert(discriminator == 0 || discriminator == 1 || discriminator == 2);
	if (pseudo->type == PSEUDO_LUASTACK) {
		// Note pseudo->stackidx is relative to ci->func
		// But ci->func is not always base-1 because of var args
		// Therefore we need a different way to compute these
		raviX_buffer_add_fstring(&fn->body, "S(%d)", pseudo->stackidx);
	} else if (pseudo->type == PSEUDO_TEMP_ANY || pseudo->type == PSEUDO_RANGE ||
		   pseudo->type == PSEUDO_RANGE_SELECT) {
		raviX_buffer_add_fstring(&fn->body, "R(%d)", compute_register_from_base(fn, pseudo));
	} else if (pseudo->type == PSEUDO_SYMBOL) {
		if (pseudo->symbol->symbol_type == SYM_LOCAL) {
			raviX_buffer_add_fstring(&fn->body, "R(%d)", compute_register_from_base(fn, pseudo));
		} else if (pseudo->symbol->symbol_type == SYM_UPVALUE) {
			raviX_buffer_add_fstring(&fn->body, "cl->upvals[%d]->v", pseudo->symbol->upvalue.upvalue_index);
		} else {
			handle_error_bad_pseudo(fn, pseudo, "emit_reg_accessor: Unexpected pseudo symbol type");
			return -1;
		}
	} else if (pseudo->type == PSEUDO_CONSTANT) {
		if (pseudo->constant->type == RAVI_TSTRING) {
			unsigned k = pseudo->constant->index;
			raviX_buffer_add_fstring(&fn->body, "K(%d)", k);
		} else if (pseudo->constant->type == RAVI_TNUMINT) {
			raviX_buffer_add_fstring(&fn->body, "&ival%u; ival%u.value_.i = %lld", discriminator,
						 discriminator, pseudo->constant->i);
		} else if (pseudo->constant->type == RAVI_TNUMFLT) {
			raviX_buffer_add_fstring(&fn->body, "&fval%u; fval%u.value_.n = ", discriminator,
						 discriminator);
			raviX_buffer_add_double(&fn->body, pseudo->constant->n);
		} else if (pseudo->constant->type == RAVI_TNIL) {
			raviX_buffer_add_string(&fn->body, "&nilval");
		} else if (pseudo->constant->type == RAVI_TBOOLEAN) {
			raviX_buffer_add_fstring(&fn->body, "&bval%u; bval%u.value_.b = %d", discriminator,
						 discriminator, (int)pseudo->constant->i);
		} else {
			handle_error_bad_pseudo(fn, pseudo, "emit_reg_accessor: Unexpected pseudo constant type");
			return -1;
		}
	} else if (pseudo->type == PSEUDO_TEMP_FLT) {
		raviX_buffer_add_fstring(&fn->body, "&fval%u; fval%u.value_.n = ", discriminator, discriminator);
		emit_varname(fn, pseudo);
	} else if (pseudo->type == PSEUDO_TEMP_INT) {
		raviX_buffer_add_fstring(&fn->body, "&ival%u; ival%u.value_.i = ", discriminator, discriminator);
		emit_varname(fn, pseudo);
	} else if (pseudo->type == PSEUDO_NIL) {
		raviX_buffer_add_string(&fn->body, "&nilval");
	} else if (pseudo->type == PSEUDO_TRUE) {
		raviX_buffer_add_fstring(&fn->body, "&bval%u; bval%u.value_.b = 1", discriminator, discriminator);
	} else if (pseudo->type == PSEUDO_FALSE) {
		raviX_buffer_add_fstring(&fn->body, "&bval%u; bval%u.value_.b = 0", discriminator, discriminator);
	} else if (pseudo->type == PSEUDO_TEMP_BOOL) {
		raviX_buffer_add_fstring(&fn->body, "&bval%u; bval%u.value_.b = ", discriminator, discriminator);
		emit_varname(fn, pseudo);
	} else {
		handle_error_bad_pseudo(fn, pseudo, "emit_reg_accessor: Unexpected pseudo type");
		return -1;
	}
	return 0;
}